

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::ConfigureString
          (cmMakefile *this,string *input,string *output,bool atOnly,bool escapeQuotes)

{
  bool bVar1;
  char *pcVar2;
  cmValue cVar3;
  long *plVar4;
  long line_00;
  cmListFileContext *pcVar5;
  undefined7 in_register_00000009;
  ulong *puVar6;
  size_type *psVar7;
  undefined7 in_register_00000081;
  pointer filename;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  string_view value;
  string_view value_00;
  string indentation;
  string local_f8;
  string local_d8;
  undefined4 local_b8;
  undefined4 local_b4;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RegularExpression *local_48;
  string *local_40;
  RegularExpression *local_38;
  
  local_b8 = (undefined4)CONCAT71(in_register_00000081,escapeQuotes);
  local_b4 = (undefined4)CONCAT71(in_register_00000009,atOnly);
  if (input->_M_string_length != 0) {
    pcVar10 = (input->_M_dataplus)._M_p;
    pcVar2 = pcVar10 + input->_M_string_length;
    local_38 = &this->cmDefineRegex;
    local_48 = &this->cmDefine01Regex;
    pcVar8 = pcVar10;
    local_40 = input;
LAB_001b6949:
    do {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      pcVar9 = pcVar8;
      if (*pcVar8 != '\n') {
        pcVar8 = pcVar8 + 1;
        pcVar9 = pcVar2;
        if (pcVar8 != pcVar2) goto LAB_001b6949;
      }
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&line,pcVar10,pcVar9);
      pcVar10 = (input->_M_dataplus)._M_p + input->_M_string_length;
      bVar1 = cmsys::RegularExpression::find(local_38,line._M_dataplus._M_p,&local_38->regmatch);
      if (bVar1) {
        pcVar8 = (this->cmDefineRegex).regmatch.startp[2];
        if (pcVar8 == (char *)0x0) {
          indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
          indentation._M_string_length = 0;
          indentation.field_2._M_local_buf[0] = '\0';
        }
        else {
          indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&indentation,pcVar8,(this->cmDefineRegex).regmatch.endp[2]);
        }
        cVar3 = GetDefinition(this,&indentation);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)indentation._M_dataplus._M_p != &indentation.field_2) {
          operator_delete(indentation._M_dataplus._M_p,
                          CONCAT71(indentation.field_2._M_allocated_capacity._1_7_,
                                   indentation.field_2._M_local_buf[0]) + 1);
        }
        if ((cVar3.Value == (string *)0x0) ||
           (value._M_str = ((cVar3.Value)->_M_dataplus)._M_p,
           value._M_len = (cVar3.Value)->_M_string_length, bVar1 = cmValue::IsOff(value), bVar1)) {
          std::__cxx11::string::append((char *)output);
          pcVar8 = (this->cmDefineRegex).regmatch.startp[2];
          if (pcVar8 == (char *)0x0) {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            indentation._M_string_length = 0;
            indentation.field_2._M_local_buf[0] = '\0';
          }
          else {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&indentation,pcVar8,(this->cmDefineRegex).regmatch.endp[2]);
          }
          std::__cxx11::string::_M_append((char *)output,(ulong)indentation._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)indentation._M_dataplus._M_p != &indentation.field_2) {
            operator_delete(indentation._M_dataplus._M_p,
                            CONCAT71(indentation.field_2._M_allocated_capacity._1_7_,
                                     indentation.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::string::append((char *)output);
        }
        else {
          pcVar8 = (this->cmDefineRegex).regmatch.startp[1];
          if (pcVar8 == (char *)0x0) {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            indentation._M_string_length = 0;
            indentation.field_2._M_local_buf[0] = '\0';
          }
          else {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&indentation,pcVar8,(this->cmDefineRegex).regmatch.endp[1]);
          }
          std::operator+(&local_68,"#",&indentation);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          puVar6 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar6) {
            local_f8.field_2._M_allocated_capacity = *puVar6;
            local_f8.field_2._8_8_ = plVar4[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *puVar6;
            local_f8._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_f8._M_string_length = plVar4[1];
          *plVar4 = (long)puVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::operator+(&local_88,"#",&indentation);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_d8.field_2._M_allocated_capacity = *psVar7;
            local_d8.field_2._8_8_ = plVar4[3];
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar7;
            local_d8._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_d8._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          cmsys::SystemTools::ReplaceString(&line,&local_f8,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)output,(ulong)line._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)indentation._M_dataplus._M_p != &indentation.field_2) {
            operator_delete(indentation._M_dataplus._M_p,
                            CONCAT71(indentation.field_2._M_allocated_capacity._1_7_,
                                     indentation.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      else {
        bVar1 = cmsys::RegularExpression::find(local_48,line._M_dataplus._M_p,&local_48->regmatch);
        if (bVar1) {
          pcVar8 = (this->cmDefine01Regex).regmatch.startp[1];
          if (pcVar8 == (char *)0x0) {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            indentation._M_string_length = 0;
            indentation.field_2._M_local_buf[0] = '\0';
          }
          else {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&indentation,pcVar8,(this->cmDefine01Regex).regmatch.endp[1]);
          }
          pcVar8 = (this->cmDefine01Regex).regmatch.startp[2];
          if (pcVar8 == (char *)0x0) {
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            local_f8._M_string_length = 0;
            local_f8.field_2._M_allocated_capacity =
                 local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f8,pcVar8,(this->cmDefine01Regex).regmatch.endp[2]);
          }
          cVar3 = GetDefinition(this,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_68,"#",&indentation);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          puVar6 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar6) {
            local_f8.field_2._M_allocated_capacity = *puVar6;
            local_f8.field_2._8_8_ = plVar4[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *puVar6;
            local_f8._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_f8._M_string_length = plVar4[1];
          *plVar4 = (long)puVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::operator+(&local_88,"#",&indentation);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_d8.field_2._M_allocated_capacity = *psVar7;
            local_d8.field_2._8_8_ = plVar4[3];
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar7;
            local_d8._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_d8._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          cmsys::SystemTools::ReplaceString(&line,&local_f8,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)output,(ulong)line._M_dataplus._M_p);
          if (cVar3.Value != (string *)0x0) {
            value_00._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
            value_00._M_len = (cVar3.Value)->_M_string_length;
            cmValue::IsOff(value_00);
          }
          std::__cxx11::string::append((char *)output);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)indentation._M_dataplus._M_p != &indentation.field_2) {
            operator_delete(indentation._M_dataplus._M_p,
                            CONCAT71(indentation.field_2._M_allocated_capacity._1_7_,
                                     indentation.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append((char *)output,(ulong)line._M_dataplus._M_p);
        }
      }
      if (pcVar9 != pcVar10) {
        std::__cxx11::string::append((char *)output);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p,line.field_2._M_allocated_capacity + 1);
      }
      pcVar10 = pcVar9 + (pcVar9 != pcVar10);
      pcVar2 = (local_40->_M_dataplus)._M_p + local_40->_M_string_length;
      input = local_40;
      pcVar8 = pcVar10;
    } while (pcVar10 != pcVar2);
  }
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (bVar1) {
    line_00 = -1;
    filename = (char *)0x0;
  }
  else {
    pcVar5 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       (&(this->Backtrace).
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    filename = (pcVar5->FilePath)._M_dataplus._M_p;
    line_00 = pcVar5->Line;
  }
  ExpandVariablesInString
            (this,output,SUB41(local_b8,0),true,SUB41(local_b4,0),filename,line_00,true,true);
  return;
}

Assistant:

void cmMakefile::ConfigureString(const std::string& input, std::string& output,
                                 bool atOnly, bool escapeQuotes) const
{
  // Split input to handle one line at a time.
  std::string::const_iterator lineStart = input.begin();
  while (lineStart != input.end()) {
    // Find the end of this line.
    std::string::const_iterator lineEnd = lineStart;
    while (lineEnd != input.end() && *lineEnd != '\n') {
      ++lineEnd;
    }

    // Copy the line.
    std::string line(lineStart, lineEnd);

    // Skip the newline character.
    bool haveNewline = (lineEnd != input.end());
    if (haveNewline) {
      ++lineEnd;
    }

    // Replace #cmakedefine instances.
    if (this->cmDefineRegex.find(line)) {
      cmValue def = this->GetDefinition(this->cmDefineRegex.match(2));
      if (!cmIsOff(def)) {
        const std::string indentation = this->cmDefineRegex.match(1);
        cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine",
                                     "#" + indentation + "define");
        output += line;
      } else {
        output += "/* #undef ";
        output += this->cmDefineRegex.match(2);
        output += " */";
      }
    } else if (this->cmDefine01Regex.find(line)) {
      const std::string indentation = this->cmDefine01Regex.match(1);
      cmValue def = this->GetDefinition(this->cmDefine01Regex.match(2));
      cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine01",
                                   "#" + indentation + "define");
      output += line;
      if (!cmIsOff(def)) {
        output += " 1";
      } else {
        output += " 0";
      }
    } else {
      output += line;
    }

    if (haveNewline) {
      output += "\n";
    }

    // Move to the next line.
    lineStart = lineEnd;
  }

  // Perform variable replacements.
  const char* filename = nullptr;
  long lineNumber = -1;
  if (!this->Backtrace.Empty()) {
    const auto& currentTrace = this->Backtrace.Top();
    filename = currentTrace.FilePath.c_str();
    lineNumber = currentTrace.Line;
  }
  this->ExpandVariablesInString(output, escapeQuotes, true, atOnly, filename,
                                lineNumber, true, true);
}